

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

QRgba64 * qt_fetch_conical_gradient_rgb64
                    (QRgba64 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  Type TVar1;
  QRgba64 *b;
  QRgba64 *pQVar2;
  QRgba64 *pQVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  qreal qVar8;
  double dVar9;
  double dVar10;
  
  dVar5 = (double)y + 0.5;
  dVar6 = (double)x + 0.5;
  dVar9 = dVar6 * data->m11 + dVar5 * data->m21 + data->dx;
  dVar10 = dVar6 * data->m12 + dVar5 * data->m22 + data->dy;
  dVar7 = data->m13;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    pQVar2 = buffer + length;
    qVar8 = data->m23;
  }
  else {
    qVar8 = data->m23;
    pQVar2 = buffer + length;
    if ((qVar8 == 0.0) && (!NAN(qVar8))) {
      dVar9 = dVar9 - *(double *)((long)&data->field_23 + 8);
      dVar10 = dVar10 - *(double *)((long)&data->field_23 + 0x10);
      for (pQVar3 = buffer; pQVar3 < pQVar2; pQVar3 = pQVar3 + 1) {
        dVar7 = atan2(dVar10,dVar9);
        TVar1 = GradientBase64::fetchSingle
                          (&(data->field_23).gradient,
                           (dVar7 + *(double *)((long)&data->field_23 + 0x18)) *
                           -0.15915494309189535 + 1.0);
        pQVar3->rgba = TVar1.rgba;
        dVar9 = dVar9 + data->m11;
        dVar10 = dVar10 + data->m12;
      }
      return buffer;
    }
  }
  dVar7 = dVar7 * dVar6 + qVar8 * dVar5 + data->m33;
  uVar4 = -(ulong)(dVar7 != 0.0);
  dVar7 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)dVar7 & uVar4);
  for (pQVar3 = buffer; pQVar3 < pQVar2; pQVar3 = pQVar3 + 1) {
    dVar5 = atan2(dVar10 / dVar7 - *(double *)((long)&data->field_23 + 8),
                  dVar9 / dVar7 - *(double *)((long)&data->field_23 + 0x10));
    TVar1 = GradientBase64::fetchSingle
                      (&(data->field_23).gradient,
                       (dVar5 + *(double *)((long)&data->field_23 + 0x18)) * -0.15915494309189535 +
                       1.0);
    pQVar3->rgba = TVar1.rgba;
    dVar9 = dVar9 + data->m11;
    dVar10 = dVar10 + data->m12;
    dVar7 = dVar7 + data->m13;
    dVar7 = (double)((ulong)dVar7 & -(ulong)(dVar7 != 0.0) |
                    ~-(ulong)(dVar7 != 0.0) & (ulong)(data->m13 + dVar7));
  }
  return buffer;
}

Assistant:

static const QRgba64 * QT_FASTCALL qt_fetch_conical_gradient_rgb64(QRgba64 *buffer, const Operator *, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_conical_gradient_template<GradientBase64, QRgba64>(buffer, data, y, x, length);
}